

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O0

bool __thiscall moira::Moira::isValidExt(Moira *this,Instr I,Mode M,u16 op,u32 ext)

{
  u32 ext_local;
  u16 op_local;
  Mode M_local;
  Instr I_local;
  Moira *this_local;
  
  switch(I) {
  case BFCHG:
    this_local._7_1_ = (ext & 0xf000) == 0;
    break;
  case BFCLR:
    this_local._7_1_ = (ext & 0xf000) == 0;
    break;
  case BFEXTS:
    this_local._7_1_ = (ext & 0x8000) == 0;
    break;
  case BFEXTU:
    this_local._7_1_ = (ext & 0x8000) == 0;
    break;
  case BFFFO:
    this_local._7_1_ = (ext & 0x8000) == 0;
    break;
  case BFINS:
    this_local._7_1_ = (ext & 0x8000) == 0;
    break;
  case BFSET:
    this_local._7_1_ = (ext & 0xf000) == 0;
    break;
  case BFTST:
    this_local._7_1_ = (ext & 0xf000) == 0;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                  ,0x318,"bool moira::Moira::isValidExt(Instr, Mode, u16, u32) const");
  case CAS:
    this_local._7_1_ = (ext & 0xfe38) == 0;
    break;
  case CAS2:
    this_local._7_1_ = (ext & 0xe380e38) == 0;
    break;
  case CHK2:
    this_local._7_1_ = (ext & 0x7ff) == 0;
    break;
  case CMP2:
    this_local._7_1_ = (ext & 0xfff) == 0;
    break;
  case DIVL:
    this_local._7_1_ = (ext & 0x83f8) == 0;
    break;
  case MULL:
    this_local._7_1_ = (ext & 0x83f8) == 0;
  }
  return this_local._7_1_;
}

Assistant:

bool
Moira::isValidExt(Instr I, Mode M, u16 op, u32 ext) const
{
    switch (I) {

        case Instr::BFCHG:     return (ext & 0xF000) == 0;
        case Instr::BFCLR:     return (ext & 0xF000) == 0;
        case Instr::BFEXTS:    return (ext & 0x8000) == 0;
        case Instr::BFEXTU:    return (ext & 0x8000) == 0;
        case Instr::BFFFO:     return (ext & 0x8000) == 0;
        case Instr::BFINS:     return (ext & 0x8000) == 0;
        case Instr::BFSET:     return (ext & 0xF000) == 0;
        case Instr::BFTST:     return (ext & 0xF000) == 0;
        case Instr::CAS:       return (ext & 0xFE38) == 0;
        case Instr::CAS2:      return (ext & 0x0E380E38) == 0;
        case Instr::CHK2:      return (ext & 0x07FF) == 0;
        case Instr::CMP2:      return (ext & 0x0FFF) == 0;
        case Instr::MULL:      return (ext & 0x83F8) == 0;
        case Instr::DIVL:      return (ext & 0x83F8) == 0;

        default:
            fatalError;
    }
}